

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Binary * __thiscall
wasm::anon_unknown_233::FinalOptimizer::optimize(FinalOptimizer *this,Binary *curr)

{
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher;
  bool bVar1;
  BinaryOp BVar2;
  BinaryOp BVar3;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R8;
  Literal local_f0;
  int64_t local_d8;
  int64_t value;
  Literal local_b8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_a0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_60 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_50;
  Const *local_28;
  Const *c;
  Binary *curr_local;
  FinalOptimizer *this_local;
  
  c = (Const *)curr;
  curr_local = (Binary *)this;
  local_60[0] = Match::any();
  Match::ival(&local_a0,&local_28);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_50,(Match *)0x3,(Op)local_60,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_a0,in_R8);
  matcher.data = local_50.data;
  matcher._12_4_ = local_50._12_4_;
  matcher.binder = local_50.binder;
  matcher.submatchers.curr = local_50.submatchers.curr;
  matcher.submatchers.next.curr = local_50.submatchers.next.curr;
  matcher.submatchers.next._8_8_ = local_50.submatchers.next._8_8_;
  bVar1 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    ((Expression *)curr,matcher);
  if (bVar1) {
    bVar1 = wasm::Literal::isNegative(&local_28->value);
    if (bVar1) {
      wasm::Literal::neg(&local_b8,&local_28->value);
      wasm::Literal::operator=(&local_28->value,&local_b8);
      wasm::Literal::~Literal(&local_b8);
      value = (local_28->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
              id;
      BVar3 = Abstract::getBinary((Type)value,Sub);
      (c->value).field_0.i32 = BVar3;
    }
    local_d8 = wasm::Literal::getInteger(&local_28->value);
    if ((((((local_d8 == 0x40) || (local_d8 == 0x2000)) || (local_d8 == 0x100000)) ||
         ((local_d8 == 0x8000000 || (local_d8 == 0x400000000)))) ||
        ((local_d8 == 0x20000000000 ||
         ((local_d8 == 0x1000000000000 || (local_d8 == 0x80000000000000)))))) ||
       (local_d8 == 0x4000000000000000)) {
      wasm::Literal::neg(&local_f0,&local_28->value);
      wasm::Literal::operator=(&local_28->value,&local_f0);
      wasm::Literal::~Literal(&local_f0);
      BVar3 = (c->value).field_0.i32;
      BVar2 = Abstract::getBinary((Type)(local_28->
                                        super_SpecificExpression<(wasm::Expression::Id)14>).
                                        super_Expression.type.id,Add);
      if (BVar3 == BVar2) {
        BVar3 = Abstract::getBinary((Type)(local_28->
                                          super_SpecificExpression<(wasm::Expression::Id)14>).
                                          super_Expression.type.id,Sub);
        (c->value).field_0.i32 = BVar3;
      }
      else {
        BVar3 = Abstract::getBinary((Type)(local_28->
                                          super_SpecificExpression<(wasm::Expression::Id)14>).
                                          super_Expression.type.id,Add);
        (c->value).field_0.i32 = BVar3;
      }
    }
    this_local = (FinalOptimizer *)c;
  }
  else {
    this_local = (FinalOptimizer *)0x0;
  }
  return (Binary *)this_local;
}

Assistant:

Binary* optimize(Binary* curr) {
    using namespace Abstract;
    using namespace Match;
    {
      Const* c;
      if (matches(curr, binary(Add, any(), ival(&c)))) {
        // normalize x + (-C)  ==>   x - C
        if (c->value.isNegative()) {
          c->value = c->value.neg();
          curr->op = Abstract::getBinary(c->type, Sub);
        }
        // Wasm binary encoding uses signed LEBs, which slightly favor negative
        // numbers: -64 is more efficient than +64 etc., as well as other powers
        // of two 7 bits etc. higher. we therefore prefer x - -64 over x + 64.
        // in theory we could just prefer negative numbers over positive, but
        // that can have bad effects on gzip compression (as it would mean more
        // subtractions than the more common additions).
        int64_t value = c->value.getInteger();
        if (value == 0x40LL || value == 0x2000LL || value == 0x100000LL ||
            value == 0x8000000LL || value == 0x400000000LL ||
            value == 0x20000000000LL || value == 0x1000000000000LL ||
            value == 0x80000000000000LL || value == 0x4000000000000000LL) {
          c->value = c->value.neg();
          if (curr->op == Abstract::getBinary(c->type, Add)) {
            curr->op = Abstract::getBinary(c->type, Sub);
          } else {
            curr->op = Abstract::getBinary(c->type, Add);
          }
        }
        return curr;
      }
    }
    return nullptr;
  }